

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

small_vector<long,_4UL,_0UL,_std::allocator<long>_> * __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::operator=
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,
          small_vector<long,_4UL,_0UL,_std::allocator<long>_> *v)

{
  long *plVar1;
  long *plVar2;
  size_t sVar3;
  long *plVar4;
  
  if (this != v) {
    this->m_end = this->m_begin;
    plVar2 = choose_data(this,(long)v->m_end - (long)v->m_begin >> 3);
    this->m_end = plVar2;
    this->m_begin = plVar2;
    plVar1 = plVar2;
    for (plVar4 = v->m_begin; plVar4 != v->m_end; plVar4 = plVar4 + 1) {
      *plVar1 = *plVar4;
      this->m_end = plVar1 + 1;
      plVar1 = plVar1 + 1;
    }
    if ((type *)plVar2 == this->m_static_data) {
      sVar3 = 4;
    }
    else {
      sVar3 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar3;
  }
  return this;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }